

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O2

void __thiscall
btDbvtBroadphase::destroyProxy
          (btDbvtBroadphase *this,btBroadphaseProxy *absproxy,btDispatcher *dispatcher)

{
  btDbvt *this_00;
  
  this_00 = (btDbvt *)&this->field_0x8;
  if (absproxy[1].m_uniqueId == 2) {
    this_00 = (btDbvt *)&this->field_0x68;
  }
  btDbvt::remove(this_00,(char *)absproxy[1].m_clientObject);
  listremove<btDbvtProxy>((btDbvtProxy *)absproxy,this->m_stageRoots + absproxy[1].m_uniqueId);
  (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[4])
            (this->m_paircache,absproxy,dispatcher);
  btAlignedFreeInternal(absproxy);
  this->m_needcleanup = true;
  return;
}

Assistant:

void							btDbvtBroadphase::destroyProxy(	btBroadphaseProxy* absproxy,
															   btDispatcher* dispatcher)
{
	btDbvtProxy*	proxy=(btDbvtProxy*)absproxy;
	if(proxy->stage==STAGECOUNT)
		m_sets[1].remove(proxy->leaf);
	else
		m_sets[0].remove(proxy->leaf);
	listremove(proxy,m_stageRoots[proxy->stage]);
	m_paircache->removeOverlappingPairsContainingProxy(proxy,dispatcher);
	btAlignedFree(proxy);
	m_needcleanup=true;
}